

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O2

void testRunner<true,false>(void)

{
  bool bVar1;
  int iVar2;
  IResultCapture *pIVar3;
  IMutableContext *pIVar4;
  undefined4 extraout_var;
  string prev_directory;
  string initial_dbpath;
  string name;
  SQLLogicTestRunner runner;
  allocator local_3d2;
  allocator local_3d1;
  string local_3d0;
  string local_3b0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_390;
  size_type local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  allocator local_370 [32];
  string local_350;
  string local_330 [32];
  string local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  SQLLogicTestRunner local_270;
  
  pIVar3 = Catch::getResultCapture();
  (*pIVar3->_vptr_IResultCapture[0x15])(local_330,pIVar3);
  local_388 = 0;
  local_380._M_local_buf[0] = '\0';
  local_390 = &local_380;
  bVar1 = duckdb::TestForceStorage();
  if (bVar1) {
    std::__cxx11::string::string(local_290,local_330);
    std::__cxx11::string::string((string *)&local_3d0,"/",local_370);
    std::__cxx11::string::string(local_3b0,"_",&local_3d2);
    duckdb::StringUtil::Replace(&local_270,local_290,&local_3d0,local_3b0);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string(local_290);
    std::__cxx11::string::string(local_2b0,(string *)&local_270);
    std::__cxx11::string::string(local_3b0,".",&local_3d2);
    std::__cxx11::string::string((string *)local_370,"_",&local_3d1);
    duckdb::StringUtil::Replace(&local_3d0,local_2b0,local_3b0,local_370);
    std::__cxx11::string::operator=((string *)&local_270,(string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)local_370);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_2b0);
    std::__cxx11::string::string(local_2d0,(string *)&local_270);
    std::__cxx11::string::string(local_3b0,"\\",&local_3d2);
    std::__cxx11::string::string((string *)local_370,"_",&local_3d1);
    duckdb::StringUtil::Replace(&local_3d0,local_2d0,local_3b0,local_370);
    std::__cxx11::string::operator=((string *)&local_270,(string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)local_370);
    std::__cxx11::string::~string(local_3b0);
    std::__cxx11::string::~string(local_2d0);
    std::operator+(&local_2f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_270,
                   ".db");
    duckdb::TestCreatePath(&local_3d0,(string *)&local_2f0);
    std::__cxx11::string::operator=((string *)&local_390,(string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_3d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    std::__cxx11::string::~string((string *)&local_270);
  }
  local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
  if (local_390 == &local_380) {
    local_350.field_2._8_8_ = local_380._8_8_;
  }
  else {
    local_350._M_dataplus._M_p = (pointer)local_390;
  }
  local_350.field_2._M_allocated_capacity._1_7_ = local_380._M_allocated_capacity._1_7_;
  local_350.field_2._M_local_buf[0] = local_380._M_local_buf[0];
  local_350._M_string_length = local_388;
  local_388 = 0;
  local_380._M_local_buf[0] = '\0';
  local_390 = &local_380;
  duckdb::SQLLogicTestRunner::SQLLogicTestRunner(&local_270,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  pIVar4 = Catch::getCurrentMutableContext();
  iVar2 = (*(pIVar4->super_IContext)._vptr_IContext[4])(pIVar4);
  local_270.output_sql = (bool)(**(code **)(**(long **)CONCAT44(extraout_var,iVar2) + 0xb8))();
  local_270.enable_verification = true;
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0._M_string_length = 0;
  local_3d0.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_310,local_330);
  duckdb::SQLLogicTestRunner::ExecuteFile(&local_270,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  duckdb::ClearTestDirectory();
  std::__cxx11::string::~string((string *)&local_3d0);
  duckdb::SQLLogicTestRunner::~SQLLogicTestRunner(&local_270);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string(local_330);
  return;
}

Assistant:

static void testRunner() {
	// this is an ugly hack that uses the test case name to pass the script file
	// name if someone has a better idea...
	auto name = Catch::getResultCapture().getCurrentTestName();
	// fprintf(stderr, "%s\n", name.c_str());
	string initial_dbpath;
	if (TestForceStorage()) {
		auto storage_name = StringUtil::Replace(name, "/", "_");
		storage_name = StringUtil::Replace(storage_name, ".", "_");
		storage_name = StringUtil::Replace(storage_name, "\\", "_");
		initial_dbpath = TestCreatePath(storage_name + ".db");
	}
	SQLLogicTestRunner runner(std::move(initial_dbpath));
	runner.output_sql = Catch::getCurrentContext().getConfig()->outputSQL();
	runner.enable_verification = VERIFICATION;

	string prev_directory;

	// We assume the test working dir for extensions to be one dir above the test/sql. Note that this is very hacky.
	// however for now it suffices: we use it to run tests from out-of-tree extensions that are based on the extension
	// template which adheres to this convention.
	if (AUTO_SWITCH_TEST_DIR) {
		prev_directory = TestGetCurrentDirectory();

		std::size_t found = name.rfind("test/sql");
		if (found == std::string::npos) {
			throw InvalidInputException("Failed to auto detect working dir for test '" + name +
			                            "' because a non-standard path was used!");
		}
		auto test_working_dir = name.substr(0, found);

		// Parse the test dir automatically
		TestChangeDirectory(test_working_dir);
	}

	runner.ExecuteFile(name);

	if (AUTO_SWITCH_TEST_DIR) {
		TestChangeDirectory(prev_directory);
	}

	// clear test directory after running tests
	ClearTestDirectory();
}